

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setToolTip(QGraphicsItem *this,QString *toolTip)

{
  QGraphicsItemPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b0;
  QVariant local_98;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant(&local_78,(QString *)toolTip);
  (*this->_vptr_QGraphicsItem[0x21])(&local_58,this,0x13,&local_78);
  ::QVariant::~QVariant(&local_78);
  this_00 = (this->d_ptr).d;
  ::QVariant::toString();
  ::QVariant::QVariant(&local_78,(QString *)&local_b0);
  QGraphicsItemPrivate::setExtra(this_00,ExtraToolTip,&local_78);
  ::QVariant::~QVariant(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  (*this->_vptr_QGraphicsItem[0x21])(&local_98,this,0x14,&local_58);
  ::QVariant::~QVariant(&local_98);
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setToolTip(const QString &toolTip)
{
    const QVariant toolTipVariant(itemChange(ItemToolTipChange, toolTip));
    d_ptr->setExtra(QGraphicsItemPrivate::ExtraToolTip, toolTipVariant.toString());
    itemChange(ItemToolTipHasChanged, toolTipVariant);
}